

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O2

type_of_iterator * __thiscall
roaring::Roaring64MapSetBitBiDirectionalIterator::operator--
          (Roaring64MapSetBitBiDirectionalIterator *this)

{
  const_iterator *this_00;
  
  this_00 = &this->map_iter;
  if ((_Rb_tree_header *)(this->map_iter)._M_node == &(this->p->_M_t)._M_impl.super__Rb_tree_header)
  {
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator--
              (this_00);
    roaring_iterator_init_last
              ((roaring_bitmap_t *)&(this->map_iter)._M_node[1]._M_parent,
               (roaring_uint32_iterator_t *)&this->i);
    if ((this->i).has_value != false) {
      return this;
    }
  }
  roaring_uint32_iterator_previous((roaring_uint32_iterator_t *)&this->i);
  while (((this->i).has_value == false &&
         ((this->map_iter)._M_node !=
          (this->p->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left))) {
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator--
              (this_00,0);
    roaring_iterator_init_last
              ((roaring_bitmap_t *)&this_00->_M_node[1]._M_parent,
               (roaring_uint32_iterator_t *)&this->i);
  }
  return this;
}

Assistant:

type_of_iterator &operator--() {  //  --i, must return dec.value
        if (map_iter == p->cend()) {
            --map_iter;
            roaring_iterator_init_last(&map_iter->second.roaring, &i);
            if (i.has_value) return *this;
        }

        roaring_uint32_iterator_previous(&i);
        while (!i.has_value) {
            if (map_iter == p->cbegin()) return *this;
            map_iter--;
            roaring_iterator_init_last(&map_iter->second.roaring, &i);
        }
        return *this;
    }